

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

void update(float dt)

{
  cgltf_node *node_00;
  float local_84;
  mat<4,_4,_float,_(glm::qualifier)0> local_80;
  cgltf_node *local_40;
  cgltf_node *node;
  cgltf_node *__end1;
  cgltf_node *__begin1;
  Span<const_cgltf_node> *local_18;
  CSpan<cgltf_node> *__range1;
  float dt_local;
  
  if (parsedData != (cgltf_data *)0x0) {
    __range1._4_4_ = dt;
    anims::update(dt);
    tl::Vector<glm::mat<4,_4,_float,_(glm::qualifier)0>_>::resize<>
              ((Vector<glm::mat<4,_4,_float,_(glm::qualifier)0>_> *)anims::nodesMatrices,
               parsedData->nodes_count);
    getNodes();
    local_18 = (Span<const_cgltf_node> *)&__begin1;
    __end1 = tl::Span<const_cgltf_node>::begin(local_18);
    node = tl::Span<const_cgltf_node>::end(local_18);
    for (; node_00 = __end1, __end1 != node; __end1 = __end1 + 1) {
      local_40 = __end1;
      if (__end1->parent == (cgltf_node *)0x0) {
        local_84 = 1.0;
        glm::mat<4,_4,_float,_(glm::qualifier)0>::mat(&local_80,&local_84);
        calcNodesMatricesRecursive(node_00,&local_80);
      }
    }
  }
  return;
}

Assistant:

void update(float dt)
{
    if(!parsedData)
        return;

    anims::update(dt);

    anims::nodesMatrices.resize(parsedData->nodes_count);
    for(const cgltf_node& node : getNodes())
        if(node.parent == nullptr)
            calcNodesMatricesRecursive(node);
}